

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O0

int __thiscall
snmalloc::freelist::
Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
::init(Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
       *this,EVP_PKEY_CTX *ctx)

{
  reference pppvVar1;
  reference pvVar2;
  reference ppvVar3;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *pTVar4;
  address_t in_RCX;
  FreeListKey *in_RDX;
  size_t i;
  size_type in_stack_ffffffffffffffa8;
  array<void_**,_1UL> *in_stack_ffffffffffffffb0;
  undefined8 local_38;
  
  local_38 = (Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
              *)0x0;
  while (local_38 ==
         (Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
          *)0x0) {
    in_stack_ffffffffffffffb0 =
         (array<void_**,_1UL> *)
         std::array<void_*,_1UL>::operator[]
                   ((array<void_*,_1UL> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    pppvVar1 = std::array<void_**,_1UL>::operator[]
                         (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    *pppvVar1 = in_stack_ffffffffffffffb0->_M_elems;
    pvVar2 = std::array<unsigned_short,_1UL>::operator[]
                       ((array<unsigned_short,_1UL> *)in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8);
    *pvVar2 = 0;
    ppvVar3 = std::array<void_*,_1UL>::operator[]
                        ((array<void_*,_1UL> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    pTVar4 = Object::
             code_next<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                       ((address_t)ppvVar3,
                        (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                         *)ctx,in_RDX,in_RCX);
    ppvVar3 = std::array<void_*,_1UL>::operator[]
                        ((array<void_*,_1UL> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    *ppvVar3 = pTVar4;
    this = (Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
            *)0x1;
    local_38 = this;
  }
  return (int)this;
}

Assistant:

constexpr void
      init(address_t slab, const FreeListKey& key, address_t key_tweak)
      {
        for (size_t i = 0; i < LENGTH; i++)
        {
          end[i] = &head[i];
          if constexpr (TRACK_LENGTH)
          {
            length[i] = 0;
          }

          // Head is not live when a building is initialised.
          // We use this slot to store a pointer into the slab for the
          // allocations. This then establishes the invariant that head is
          // always (a possibly encoded) pointer into the slab, and thus
          // the Freelist builder always knows which block it is referring too.
          head[i] = Object::code_next(
            address_cast(&head[i]),
            useless_ptr_from_addr<Object::T<BQueue>>(slab),
            key,
            key_tweak);
        }
      }